

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

base_learner * GD::setup(options_i *options,vw *all)

{
  size_t sVar1;
  bool bVar2;
  vw *pvVar3;
  long *plVar4;
  byte bVar5;
  pointer pgVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  ostream *poVar9;
  pointer pgVar10;
  learner<GD::gd,_example> *this;
  option_group_definition *this_00;
  vw *in_RSI;
  long *in_RDI;
  float fVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  learner<GD::gd,_example> *ret;
  gd *bare;
  uint64_t stride;
  stringstream __msg;
  bool feature_mask_off;
  option_group_definition new_options;
  bool normalized;
  bool invariant;
  bool adax;
  bool adaptive;
  bool sgd;
  free_ptr<GD::gd> g;
  undefined4 in_stack_ffffffffffffede8;
  uint32_t in_stack_ffffffffffffedec;
  typed_option<double> *in_stack_ffffffffffffedf0;
  vw *in_stack_ffffffffffffedf8;
  typed_option<double> *in_stack_ffffffffffffee00;
  free_ptr<GD::gd> *dat;
  string *in_stack_ffffffffffffee08;
  _func_void_gd_ptr_base_learner_ptr_example_ptr *f;
  undefined8 in_stack_ffffffffffffee10;
  int plineNumber;
  learner<GD::gd,_example> *this_01;
  undefined4 in_stack_ffffffffffffee18;
  undefined4 in_stack_ffffffffffffee1c;
  vw_exception *in_stack_ffffffffffffee20;
  typed_option<double> *in_stack_ffffffffffffee38;
  option_group_definition *in_stack_ffffffffffffee40;
  byte local_117b;
  byte local_1162;
  byte local_114a;
  byte local_1137;
  byte local_1136;
  byte local_1135;
  float local_10dc;
  stringstream local_f68 [16];
  ostream local_f58;
  allocator local_dd9;
  string local_dd8 [37];
  byte local_db3;
  byte local_db2;
  allocator local_db1;
  string local_db0 [39];
  allocator local_d89;
  string local_d88 [39];
  allocator local_d61;
  string local_d60 [39];
  allocator local_d39;
  string local_d38 [38];
  undefined1 local_d12;
  allocator local_d11;
  string local_d10 [39];
  allocator local_ce9;
  string local_ce8 [32];
  typed_option<double> local_cc8 [2];
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [32];
  typed_option<double> local_b38 [2];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [359];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [359];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [359];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [359];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [359];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [375];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [59];
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  free_ptr<GD::gd> local_20;
  vw *local_10;
  long *local_8;
  
  plineNumber = (int)((ulong)in_stack_ffffffffffffee10 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  scoped_calloc_or_throw<GD::gd>();
  local_21 = 0;
  local_22 = 0;
  local_23 = 0;
  local_24 = 0;
  local_25 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Gradient Descent options",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"sgd",&local_1f9);
  VW::config::make_option<bool>
            ((string *)in_stack_ffffffffffffedf8,(bool *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"use regular stochastic gradient descent update.",&local_221);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee40,(typed_option<bool> *)in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"adaptive",&local_389);
  VW::config::make_option<bool>
            ((string *)in_stack_ffffffffffffedf8,(bool *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"use adaptive, individual learning rates.",&local_3b1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee40,(typed_option<bool> *)in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"adax",&local_519);
  VW::config::make_option<bool>
            ((string *)in_stack_ffffffffffffedf8,(bool *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_540,"use adaptive learning rates with x^2 instead of g^2x^2",&local_541);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee40,(typed_option<bool> *)in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"invariant",&local_6a9);
  VW::config::make_option<bool>
            ((string *)in_stack_ffffffffffffedf8,(bool *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"use safe/importance aware updates.",&local_6d1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee40,(typed_option<bool> *)in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"normalized",&local_839);
  VW::config::make_option<bool>
            ((string *)in_stack_ffffffffffffedf8,(bool *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"use per feature normalized updates",&local_861);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffedf0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee40,(typed_option<bool> *)in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"sparse_l2",&local_9c9);
  std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
            ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1633f2);
  VW::config::make_option<float>
            ((string *)in_stack_ffffffffffffedf8,(float *)in_stack_ffffffffffffedf0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_ffffffffffffee00,
             (float)((ulong)in_stack_ffffffffffffedf8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"use per feature normalized updates",&local_9f1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffedf0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffee40,(typed_option<float> *)in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b58,"l1_state",&local_b59);
  VW::config::make_option<double>
            ((string *)in_stack_ffffffffffffedf8,(double *)in_stack_ffffffffffffedf0);
  VW::config::typed_option<double>::keep(local_b38,(bool)(local_10->save_resume & 1));
  VW::config::typed_option<double>::default_value
            (in_stack_ffffffffffffee00,(double)in_stack_ffffffffffffedf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b80,"use per feature normalized updates",&local_b81);
  VW::config::typed_option<double>::help
            (in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<double>::typed_option
            (in_stack_ffffffffffffedf0,
             (typed_option<double> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<double>
            (in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"l2_state",&local_ce9);
  VW::config::make_option<double>
            ((string *)in_stack_ffffffffffffedf8,(double *)in_stack_ffffffffffffedf0);
  VW::config::typed_option<double>::keep(local_cc8,(bool)(local_10->save_resume & 1));
  VW::config::typed_option<double>::default_value
            (in_stack_ffffffffffffee00,(double)in_stack_ffffffffffffedf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d10,"use per feature normalized updates",&local_d11);
  VW::config::typed_option<double>::help
            (in_stack_ffffffffffffedf0,
             (string *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::typed_option<double>::typed_option
            (in_stack_ffffffffffffedf0,
             (typed_option<double> *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  VW::config::option_group_definition::add<double>
            (in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
  VW::config::typed_option<double>::~typed_option(in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  VW::config::typed_option<double>::~typed_option(in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  VW::config::typed_option<double>::~typed_option(in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
  VW::config::typed_option<double>::~typed_option(in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_b59);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_8)(local_8,local_60);
  pvVar3 = local_10;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x16399e);
  pgVar6->all = pvVar3;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1639b7);
  pgVar6->all->normalized_sum_norm_x = 0.0;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1639d3);
  pgVar6->no_win_counter = 0;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1639e8);
  pgVar6->total_weight = 0.0;
  if ((local_10->adaptive & 1U) == 0) {
    local_10dc = -1.0;
  }
  else {
    local_10dc = local_10->power_t - 1.0;
  }
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x163a59);
  pgVar6->neg_norm_power = local_10dc;
  fVar11 = local_10->power_t;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x163a9a);
  pgVar6->neg_power_t = -fVar11;
  bVar2 = local_10->adaptive;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x163aca);
  pgVar6->adaptive = (bool)(bVar2 & 1);
  bVar2 = local_10->normalized_updates;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x163af9);
  pgVar6->normalized = (bool)(bVar2 & 1);
  if (0.0 < local_10->initial_t) {
    fVar11 = local_10->initial_t;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x163b4c);
    pgVar6->all->normalized_sum_norm_x = (double)fVar11;
    fVar11 = local_10->initial_t;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x163b8b);
    pgVar6->total_weight = (double)fVar11;
  }
  plVar4 = local_8;
  local_d12 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d38,"feature_mask",&local_d39);
  bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_d38);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  if ((bVar5 & 1) != 0) {
    local_d12 = 0;
  }
  if ((local_10->holdout_set_off & 1U) == 0) {
    local_10->sd->holdout_best_loss = 3.4028234663852886e+38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d60,"early_terminate",&local_d61);
    VW::config::options_i::get_typed_option<unsigned_long>
              ((options_i *)in_stack_ffffffffffffee20,
               (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
    uVar7 = VW::config::typed_option<unsigned_long>::value
                      ((typed_option<unsigned_long> *)in_stack_ffffffffffffedf0);
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164437);
    pgVar6->early_stop_thres = uVar7;
    std::__cxx11::string::~string(local_d60);
    std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  }
  fVar11 = local_10->initial_constant;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x1644ce);
  plVar4 = local_8;
  pgVar6->initial_constant = fVar11;
  if (((((local_21 & 1) == 0) && ((local_22 & 1) == 0)) && ((local_24 & 1) == 0)) &&
     ((local_25 & 1) == 0)) {
    local_10->adaptive = (bool)(local_10->training & 1);
    local_10->invariant_updates = (bool)(local_10->training & 1);
    local_10->normalized_updates = (bool)(local_10->training & 1);
  }
  else {
    local_1135 = 0;
    if ((local_10->training & 1U) != 0) {
      local_1135 = local_22;
    }
    local_10->adaptive = (bool)(local_1135 & 1);
    local_1136 = 0;
    if ((local_10->training & 1U) != 0) {
      local_1136 = local_24;
    }
    local_10->invariant_updates = (bool)(local_1136 & 1);
    local_1137 = 0;
    if ((local_10->training & 1U) != 0) {
      local_1137 = local_25;
    }
    local_10->normalized_updates = (bool)(local_1137 & 1);
    std::allocator<char>::allocator();
    local_db2 = 0;
    local_db3 = 0;
    std::__cxx11::string::string(local_d88,"learning_rate",&local_d89);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_d88);
    plVar4 = local_8;
    local_114a = 0;
    if ((bVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      local_db2 = 1;
      std::__cxx11::string::string(local_db0,"l",&local_db1);
      local_db3 = 1;
      bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_db0);
      local_114a = 0;
      if ((bVar5 & 1) == 0) {
        local_1162 = 0;
        if ((local_10->adaptive & 1U) != 0) {
          local_1162 = local_10->normalized_updates;
        }
        local_114a = local_1162 ^ 0xff;
      }
    }
    if ((local_db3 & 1) != 0) {
      std::__cxx11::string::~string(local_db0);
    }
    if ((local_db2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_db1);
    }
    std::__cxx11::string::~string(local_d88);
    std::allocator<char>::~allocator((allocator<char> *)&local_d89);
    if ((local_114a & 1) != 0) {
      local_10->eta = 10.0;
    }
    if (((local_10->adaptive & 1U) == 0) && ((local_10->normalized_updates & 1U) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_dd8,"initial_t",&local_dd9);
      bVar5 = (**(code **)(*local_8 + 8))(local_8,local_dd8);
      std::__cxx11::string::~string(local_dd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
      if (((bVar5 ^ 0xff) & 1) != 0) {
        local_10->sd->t = 1.0;
        local_10->initial_t = 1.0;
      }
      fVar11 = powf((float)local_10->sd->t,local_10->power_t);
      local_10->eta = fVar11 * local_10->eta;
    }
  }
  if ((local_23 & 1) != 0) {
    local_117b = 0;
    if ((local_10->training & 1U) != 0) {
      local_117b = local_23;
    }
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164a86);
    pgVar6->adax = (bool)(local_117b & 1);
  }
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164aa0);
  if (((pgVar6->adax & 1U) != 0) && ((local_10->adaptive & 1U) == 0)) {
    std::__cxx11::stringstream::stringstream(local_f68);
    std::operator<<(&local_f58,"Cannot use adax without adaptive");
    uVar8 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_ffffffffffffee20,
               (char *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18),plineNumber,
               in_stack_ffffffffffffee08);
    __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  sVar1 = local_10->numpasses;
  auVar13._8_4_ = (int)(sVar1 >> 0x20);
  auVar13._0_8_ = sVar1;
  auVar13._12_4_ = 0x45300000;
  dVar12 = pow((double)local_10->eta_decay_rate,
               (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  if (dVar12 < 0.0001) {
    poVar9 = std::operator<<(&(local_10->trace_message).super_ostream,
                             "Warning: the learning rate for the last pass is multiplied by: ");
    sVar1 = local_10->numpasses;
    auVar14._8_4_ = (int)(sVar1 >> 0x20);
    auVar14._0_8_ = sVar1;
    auVar14._12_4_ = 0x45300000;
    dVar12 = pow((double)local_10->eta_decay_rate,
                 (auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
    poVar9 = std::operator<<(poVar9," adjust --decay_learning_rate larger to avoid this.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  if (local_10->reg_mode % 2 == 0) {
    if (((local_10->audit & 1U) == 0) && ((local_10->hash_inv & 1U) == 0)) {
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164dea);
      pgVar6->predict = predict<false,false>;
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164e02);
      pgVar6->multipredict = multipredict<false,false>;
    }
    else {
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164db8);
      pgVar6->predict = predict<false,true>;
      pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                         ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164dd0);
      pgVar6->multipredict = multipredict<false,true>;
    }
  }
  else if (((local_10->audit & 1U) == 0) && ((local_10->hash_inv & 1U) == 0)) {
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164d61);
    pgVar6->predict = predict<true,false>;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164d79);
    pgVar6->multipredict = multipredict<true,false>;
  }
  else {
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164d2f);
    pgVar6->predict = predict<true,true>;
    pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                       ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164d47);
    pgVar6->multipredict = multipredict<true,true>;
  }
  if ((local_10->power_t != 0.5) || (NAN(local_10->power_t))) {
    std::unique_ptr<GD::gd,_void_(*)(void_*)>::get
              ((unique_ptr<GD::gd,_void_(*)(void_*)> *)in_stack_ffffffffffffedf0);
    set_learn<false>(in_stack_ffffffffffffedf8,SUB81((ulong)in_stack_ffffffffffffedf0 >> 0x38,0),
                     (gd *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  }
  else {
    std::unique_ptr<GD::gd,_void_(*)(void_*)>::get
              ((unique_ptr<GD::gd,_void_(*)(void_*)> *)in_stack_ffffffffffffedf0);
    set_learn<true>(in_stack_ffffffffffffedf8,SUB81((ulong)in_stack_ffffffffffffedf0 >> 0x38,0),
                    (gd *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  }
  ceil_log_2(CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  parameters::stride_shift((parameters *)in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
  dat = &local_20;
  pgVar6 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::get
                     ((unique_ptr<GD::gd,_void_(*)(void_*)> *)in_stack_ffffffffffffedf0);
  pgVar10 = std::unique_ptr<GD::gd,_void_(*)(void_*)>::operator->
                      ((unique_ptr<GD::gd,_void_(*)(void_*)> *)0x164f32);
  f = pgVar10->learn;
  this_01 = (learner<GD::gd,_example> *)pgVar6->predict;
  parameters::stride_shift
            ((parameters *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  this = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                   (dat,(_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                        in_stack_ffffffffffffedf8,
                    (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                    in_stack_ffffffffffffedf0,
                    CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
  LEARNER::learner<GD::gd,_example>::set_sensitivity(this,pgVar6->sensitivity);
  LEARNER::learner<GD::gd,example>::set_multipredict<LEARNER::learner<char,char>>
            ((learner<GD::gd,example> *)this,
             (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool
              *)pgVar6->multipredict);
  LEARNER::learner<GD::gd,example>::set_update<LEARNER::learner<char,char>>
            ((learner<GD::gd,example> *)this,
             (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)pgVar6->update);
  LEARNER::learner<GD::gd,_example>::set_save_load(this,save_load);
  LEARNER::learner<GD::gd,_example>::set_end_pass(this_01,(_func_void_gd_ptr *)f);
  this_00 = (option_group_definition *)LEARNER::make_base<GD::gd,example>(this);
  VW::config::option_group_definition::~option_group_definition(this_00);
  std::unique_ptr<GD::gd,_void_(*)(void_*)>::~unique_ptr(dat);
  return (base_learner *)this_00;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}